

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O0

db_bits * __thiscall lan::db::find_rec(db *this,string *address,db_bit_type type,db_bit *ref)

{
  ulong uVar1;
  db_bit *pdVar2;
  string local_c0;
  string local_a0;
  undefined4 local_80;
  string local_70;
  undefined1 local_50 [8];
  string string;
  db_bit *ref_local;
  db_bit_type type_local;
  string *address_local;
  db *this_local;
  
  string.field_2._8_8_ = ref;
  find__pop_address((string *)local_50,this,address);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::string((string *)&local_a0,(string *)local_50);
      pdVar2 = find_any(this,&local_a0,type,(db_bit *)string.field_2._8_8_);
      string.field_2._8_8_ = pdVar2;
      std::__cxx11::string::~string((string *)&local_a0);
      if (pdVar2 != (db_bit *)0x0) {
        std::__cxx11::string::string((string *)&local_c0,(string *)address);
        this_local = (db *)find_rec(this,&local_c0,type,*(db_bit **)(string.field_2._8_8_ + 0x40));
        std::__cxx11::string::~string((string *)&local_c0);
        goto LAB_001122c7;
      }
    }
    this_local = (db *)0x0;
  }
  else {
    std::__cxx11::string::string((string *)&local_70,(string *)local_50);
    this_local = (db *)find_any(this,&local_70,type,(db_bit *)string.field_2._8_8_);
    std::__cxx11::string::~string((string *)&local_70);
  }
LAB_001122c7:
  local_80 = 1;
  std::__cxx11::string::~string((string *)local_50);
  return (db_bits *)this_local;
}

Assistant:

lan::db_bits * db::find_rec(std::string address, lan::db_bit_type const type, lan::db_bit * ref){
            std::string string = find__pop_address(address);
            if(address.empty()) {
                return find_any(string, type, ref);
            } else if(not string.empty()) {
                if((ref = find_any(string, type, ref))){
                    return find_rec(address, type, ref->lin);
                }
            } return nullptr;
        }